

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManStop(Bbl_Man_t *p)

{
  Bbl_Man_t *p_local;
  
  if (p->vId2Obj != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vId2Obj);
  }
  if (p->vObj2Id != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vObj2Id);
  }
  if (p->vFaninNums != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vFaninNums);
  }
  if (p->pFileData != (char *)0x0) {
    if (p->pFileData != (char *)0x0) {
      free(p->pFileData);
      p->pFileData = (char *)0x0;
    }
    p->pName->pArray = (char *)0x0;
    p->pObjs->pArray = (char *)0x0;
    p->pFncs->pArray = (char *)0x0;
  }
  if (p->pEnts != (Vec_Str_t *)0x0) {
    Vec_StrFree(p->pEnts);
  }
  Vec_StrFree(p->pName);
  Vec_StrFree(p->pObjs);
  Vec_StrFree(p->pFncs);
  if (p != (Bbl_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Bbl_ManStop( Bbl_Man_t * p )
{
    if ( p->vId2Obj )    Vec_IntFree( p->vId2Obj );
    if ( p->vObj2Id )    Vec_IntFree( p->vObj2Id );
    if ( p->vFaninNums ) Vec_IntFree( p->vFaninNums );
    if ( p->pFileData )
    {
        BBLIF_FREE( p->pFileData );
        p->pName->pArray = NULL;
        p->pObjs->pArray = NULL;
        p->pFncs->pArray = NULL;
    }
    if ( p->pEnts )
    Vec_StrFree( p->pEnts );
    Vec_StrFree( p->pName );
    Vec_StrFree( p->pObjs );
    Vec_StrFree( p->pFncs );
    BBLIF_FREE( p );
}